

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void check_readonly(LexState *ls,expdesc *e)

{
  expkind eVar1;
  Vardesc *pVVar2;
  Upvaldesc *pUVar3;
  char *msg_00;
  Vardesc *local_58;
  char *msg;
  Upvaldesc *up;
  Vardesc *vardesc;
  TString *varname;
  FuncState *fs;
  expdesc *e_local;
  LexState *ls_local;
  
  vardesc = (Vardesc *)0x0;
  eVar1 = e->k;
  if (eVar1 == VLOCAL) {
    pVVar2 = getlocalvardesc(ls->fs,(uint)(e->u).var.vidx);
    if ((pVVar2->vd).kind != '\0') {
      vardesc = (Vardesc *)(pVVar2->vd).name;
    }
  }
  else if (eVar1 == VUPVAL) {
    pUVar3 = ls->fs->f->upvalues + (e->u).info;
    if (pUVar3->kind != '\0') {
      vardesc = (Vardesc *)pUVar3->name;
    }
  }
  else {
    if (eVar1 != VCONST) {
      return;
    }
    vardesc = (Vardesc *)(&((ls->dyd->actvar).arr)->vd)[(e->u).info].name;
  }
  if (vardesc == (Vardesc *)0x0) {
    return;
  }
  if (*(char *)((long)vardesc + 0xb) < '\0') {
    local_58 = (Vardesc *)vardesc[1].vd.value_.gc;
  }
  else {
    local_58 = vardesc + 1;
  }
  msg_00 = luaO_pushfstring(ls->L,"attempt to assign to const variable \'%s\'",local_58);
  luaK_semerror(ls,msg_00);
}

Assistant:

static void check_readonly (LexState *ls, expdesc *e) {
  FuncState *fs = ls->fs;
  TString *varname = NULL;  /* to be set if variable is const */
  switch (e->k) {
    case VCONST: {
      varname = ls->dyd->actvar.arr[e->u.info].vd.name;
      break;
    }
    case VLOCAL: {
      Vardesc *vardesc = getlocalvardesc(fs, e->u.var.vidx);
      if (vardesc->vd.kind != VDKREG)  /* not a regular variable? */
        varname = vardesc->vd.name;
      break;
    }
    case VUPVAL: {
      Upvaldesc *up = &fs->f->upvalues[e->u.info];
      if (up->kind != VDKREG)
        varname = up->name;
      break;
    }
    default:
      return;  /* other cases cannot be read-only */
  }
  if (varname) {
    const char *msg = luaO_pushfstring(ls->L,
       "attempt to assign to const variable '%s'", getstr(varname));
    luaK_semerror(ls, msg);  /* error */
  }
}